

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

bool sanityCheck(QMdiSubWindow *child,char *where)

{
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char error [13];
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  char local_38 [35];
  char local_15 [13];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    builtin_strncpy(local_15,"null pointer",0xd);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (char *)0x0,(int)((ulong)in_RSI >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    QMessageLogger::warning(local_38,"%s:%s",in_RSI,local_15);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI != 0;
}

Assistant:

static bool sanityCheck(const QMdiSubWindow * const child, const char *where)
{
    if (Q_UNLIKELY(!child)) {
        const char error[] = "null pointer";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    return true;
}